

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

result<long,_toml::error_info> * toml::read_bin_int<long>(string *str,source_location *src)

{
  bool bVar1;
  reference pcVar2;
  success<long> s;
  source_location *in_RDX;
  source_location *in_RDI;
  char c;
  const_reverse_iterator i;
  long base;
  long val;
  long max_value;
  int max_digits;
  bool is_bounded;
  failure_type *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  source_location *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  char *__lhs;
  undefined6 in_stack_fffffffffffffda0;
  byte in_stack_fffffffffffffda6;
  byte in_stack_fffffffffffffda7;
  int in_stack_fffffffffffffdcc;
  error_info *in_stack_fffffffffffffde8;
  char local_170 [184];
  string *in_stack_ffffffffffffff48;
  source_location *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78 [3];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [2];
  char local_49;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined1 local_19;
  
  local_19 = 1;
  local_20 = 0x3f;
  local_28 = 0x7fffffffffffffff;
  local_30 = 0;
  local_38 = 1;
  psVar3 = in_RDI;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  while( true ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
              (in_stack_fffffffffffffd98);
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffda7,
                                   CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffd98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pcVar2 = CLI::std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffd90);
    local_49 = *pcVar2;
    if (local_49 == '1') {
      local_30 = local_38 + local_30;
      in_stack_fffffffffffffda7 = 0;
      if (0x3fffffffffffffff < local_38) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reverse_iterator(local_60,&local_40);
        std::
        next<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                  ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDX,
                   CONCAT17(in_stack_fffffffffffffda7,
                            CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
                  (in_stack_fffffffffffffd98);
        bVar1 = std::
                operator==<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffda7,
                                       CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)
                                      ),
                           (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffd98);
        in_stack_fffffffffffffda7 = bVar1 ^ 0xff;
      }
      if ((in_stack_fffffffffffffda7 & 1) == 0) {
        local_38 = local_38 << 1;
      }
      else {
        local_38 = 0;
      }
    }
    else {
      in_stack_fffffffffffffda6 = 0;
      if (0x3fffffffffffffff < local_38) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reverse_iterator(local_78,&local_40);
        std::
        next<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                  ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDX,
                   CONCAT17(in_stack_fffffffffffffda7,
                            CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
                  (in_stack_fffffffffffffd98);
        bVar1 = std::
                operator==<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffda7,
                                       CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)
                                      ),
                           (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffd98);
        in_stack_fffffffffffffda6 = bVar1 ^ 0xff;
      }
      if ((in_stack_fffffffffffffda6 & 1) == 0) {
        local_38 = local_38 << 1;
      }
      else {
        local_38 = 0;
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd90);
  }
  if (local_38 == 0) {
    __lhs = local_170;
    CLI::std::__cxx11::to_string(in_stack_fffffffffffffdcc);
    std::operator+(__lhs,in_stack_fffffffffffffd90);
    source_location::source_location(psVar3,in_RDX);
    CLI::std::__cxx11::to_string(in_stack_fffffffffffffdcc);
    std::operator+(__lhs,in_stack_fffffffffffffd90);
    make_error_info<>(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
    ;
    psVar3 = (source_location *)(local_170 + 0x98);
    err<toml::error_info>(in_stack_fffffffffffffde8);
    result<long,_toml::error_info>::result
              ((result<long,_toml::error_info> *)psVar3,in_stack_fffffffffffffd88);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x67b7e4);
    error_info::~error_info((error_info *)psVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
    source_location::~source_location(psVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
  }
  else {
    s = ok<long&>((long *)in_stack_fffffffffffffd88);
    result<long,_toml::error_info>::result
              ((result<long,_toml::error_info> *)psVar3,(success_type)s.value);
  }
  return (result<long,_toml::error_info> *)in_RDI;
}

Assistant:

result<T, error_info>
read_bin_int(const std::string& str, const source_location src)
{
    constexpr auto is_bounded =  std::numeric_limits<T>::is_bounded;
    constexpr auto max_digits =  std::numeric_limits<T>::digits;
    const auto max_value  = (std::numeric_limits<T>::max)();

    T val{0};
    T base{1};
    for(auto i = str.rbegin(); i != str.rend(); ++i)
    {
        const auto c = *i;
        if(c == '1')
        {
            val += base;
            // prevent `base` from overflow
            if(is_bounded && max_value / 2 < base && std::next(i) != str.rend())
            {
                base = 0;
            }
            else
            {
                base *= 2;
            }
        }
        else
        {
            assert(c == '0');

            if(is_bounded && max_value / 2 < base && std::next(i) != str.rend())
            {
                base = 0;
            }
            else
            {
                base *= 2;
            }
        }
    }
    if(base == 0)
    {
        return err(make_error_info("toml::parse_bin_integer: "
            "too large integer: current max value = 2^" + std::to_string(max_digits),
            std::move(src), "must be < 2^" + std::to_string(max_digits)));
    }
    return ok(val);
}